

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Equalizer.cpp
# Opt level: O2

int Equalizer::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  int iVar1;
  Data *data;
  bool readInputBuffer;
  float *buffer_local;
  
  buffer_local = buffer;
  data = (Data *)UnityAudioEffectState::GetEffectData<Equalizer::EffectData>(state);
  iVar1 = strcmp(name,"InputSpec");
  if (iVar1 == 0) {
    readInputBuffer = true;
  }
  else {
    iVar1 = strcmp(name,"OutputSpec");
    if (iVar1 != 0) {
      iVar1 = strcmp(name,"Coeffs");
      if (iVar1 != 0) {
        memset(buffer,0,(long)numsamples << 2);
        return 0;
      }
      SetupFilterCoeffs(data,data->DisplayFilterCoeffs,data->DisplayFilterCoeffs + 1,
                        data->DisplayFilterCoeffs + 2,(float)(state->field_0).field_0.samplerate);
      BiquadFilter::StoreCoeffs(data->DisplayFilterCoeffs + 2,&buffer_local);
      BiquadFilter::StoreCoeffs(data->DisplayFilterCoeffs + 1,&buffer_local);
      BiquadFilter::StoreCoeffs(data->DisplayFilterCoeffs,&buffer_local);
      return 0;
    }
    readInputBuffer = false;
  }
  FFTAnalyzer::ReadBuffer(&data->analyzer,buffer,numsamples,readInputBuffer);
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (strcmp(name, "InputSpec") == 0)
            data->analyzer.ReadBuffer(buffer, numsamples, true);
        else if (strcmp(name, "OutputSpec") == 0)
            data->analyzer.ReadBuffer(buffer, numsamples, false);
        else if (strcmp(name, "Coeffs") == 0)
        {
            SetupFilterCoeffs(data, &data->DisplayFilterCoeffs[0], &data->DisplayFilterCoeffs[1], &data->DisplayFilterCoeffs[2], (float)state->samplerate);
            data->DisplayFilterCoeffs[2].StoreCoeffs(buffer);
            data->DisplayFilterCoeffs[1].StoreCoeffs(buffer);
            data->DisplayFilterCoeffs[0].StoreCoeffs(buffer);
        }
        else
            memset(buffer, 0, sizeof(float) * numsamples);

        return UNITY_AUDIODSP_OK;
    }